

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

bool cppcms::encoding::validate_or_filter
               (string *encoding,char *begin,char *end,string *output,char replace)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  string *psVar5;
  string *in_RCX;
  string *in_RDX;
  char *in_RSI;
  string *in_RDI;
  string tmp_out;
  string utf8_string;
  size_t tmp_count;
  encoding_tester_type tester;
  char *in_stack_fffffffffffffe90;
  char replace_00;
  string *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  validators_set *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  allocator *paVar6;
  char *in_stack_fffffffffffffec0;
  encoding_tester_type in_stack_fffffffffffffec8;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [24];
  size_t *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_80 [32];
  string local_60 [32];
  undefined8 local_40;
  encoding_tester_type local_38;
  string *local_28;
  string *local_20;
  char *local_18;
  string *local_10;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::c_str();
  bVar1 = is_utf8(in_stack_fffffffffffffe90);
  replace_00 = (char)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  if (bVar1) {
    local_1 = anon_unknown_17::validate_or_filter_utf8
                        ((char *)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe98,replace_00);
  }
  else {
    local_38 = impl::validators_set::get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (local_38 == (encoding_tester_type)0x0) {
      local_40 = 0;
      bVar1 = valid(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                    in_stack_ffffffffffffff60);
      if (bVar1) {
        local_1 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"UTF-8",(allocator *)&stack0xffffffffffffff7f);
        booster::locale::conv::between
                  ((char *)local_60,local_18,local_20,local_80,(method_type)local_10);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
        std::__cxx11::string::string(local_b8);
        std::__cxx11::string::c_str();
        std::__cxx11::string::c_str();
        std::__cxx11::string::size();
        bVar1 = anon_unknown_17::validate_or_filter_utf8
                          ((char *)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffe98,replace_00);
        if (bVar1) {
          std::__cxx11::string::swap(local_b8);
        }
        pcVar2 = (char *)std::__cxx11::string::c_str();
        lVar3 = std::__cxx11::string::c_str();
        lVar4 = std::__cxx11::string::size();
        psVar5 = (string *)(lVar3 + lVar4);
        paVar6 = &local_f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"UTF-8",paVar6);
        booster::locale::conv::between
                  ((char *)local_d8,pcVar2,psVar5,local_10,(method_type)local_f8);
        std::__cxx11::string::operator=(local_28,local_d8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        local_1 = 0;
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_60);
      }
    }
    else {
      local_1 = anon_unknown_17::validate_or_filter_single_byte_charset
                          (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                           (char)((ulong)in_stack_fffffffffffffea8 >> 0x38));
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool CPPCMS_API validate_or_filter(	std::string const &encoding,
					char const *begin,char const *end,
					std::string &output,
					char replace)
{
	/// UTF-8 Case
	if(is_utf8(encoding.c_str()))
		return validate_or_filter_utf8(begin,end,output,replace);

	/// 8bit case
	impl::validators_set::encoding_tester_type tester = impl::all_validators.get(encoding);
	if(tester)
		return validate_or_filter_single_byte_charset(tester,begin,end,output,replace);

	size_t tmp_count = 0;
	/// Most common case
	if(valid(encoding,begin,end,tmp_count))
		return true;

	std::string utf8_string = booster::locale::conv::between(
			begin,end,
			"UTF-8",encoding,
			booster::locale::conv::skip);

	std::string tmp_out;

	if(validate_or_filter_utf8(utf8_string.c_str(),utf8_string.c_str() + utf8_string.size(),tmp_out,0)) {
		tmp_out.swap(utf8_string);
	}

	output = booster::locale::conv::between(
			tmp_out.c_str(),
			tmp_out.c_str()+tmp_out.size(),
			encoding,
			"UTF-8",
			booster::locale::conv::skip);
	return false;
}